

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockAreaLayout::takeAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *pQVar2;
  int in_EDX;
  int *in_RSI;
  long in_RDI;
  QDockAreaLayoutInfo *unaff_retaddr;
  QLayoutItem *ret_1;
  QLayoutItem *ret;
  QDockAreaLayoutInfo *dock;
  int i;
  int local_20;
  long lVar3;
  int *in_stack_fffffffffffffff8;
  
  local_20 = 0;
  lVar3 = in_RDI;
  while( true ) {
    if (3 < local_20) {
      if ((*(long *)(in_RDI + 0x20) == 0) || (iVar1 = *in_RSI, *in_RSI = iVar1 + 1, iVar1 != in_EDX)
         ) {
        pQVar2 = (QLayoutItem *)0x0;
      }
      else {
        pQVar2 = *(QLayoutItem **)(in_RDI + 0x20);
        *(undefined8 *)(in_RDI + 0x20) = 0;
      }
      return pQVar2;
    }
    pQVar2 = QDockAreaLayoutInfo::takeAt
                       (unaff_retaddr,in_stack_fffffffffffffff8,(int)((ulong)lVar3 >> 0x20));
    if (pQVar2 != (QLayoutItem *)0x0) break;
    local_20 = local_20 + 1;
  }
  return pQVar2;
}

Assistant:

QLayoutItem *QDockAreaLayout::takeAt(int *x, int index)
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.takeAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index) {
        QLayoutItem *ret = centralWidgetItem;
        centralWidgetItem = nullptr;
        return ret;
    }

    return nullptr;
}